

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

void __thiscall Rml::Context::PullDocumentToFront(Context *this,ElementDocument *document)

{
  long lVar1;
  Element *pEVar2;
  pointer puVar3;
  int iVar4;
  tuple<Rml::Element_*,_Rml::Releaser<Rml::Element>_> in_RAX;
  ElementDocument *pEVar5;
  long lVar6;
  long lVar7;
  ElementPtr element;
  __uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_> local_38;
  
  local_38._M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
       (tuple<Rml::Element_*,_Rml::Releaser<Rml::Element>_>)
       (tuple<Rml::Element_*,_Rml::Releaser<Rml::Element>_>)
       in_RAX.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  pEVar5 = (ElementDocument *)
           Element::GetLastChild
                     ((this->root)._M_t.
                      super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                      super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                      super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
  if (pEVar5 != document) {
    lVar6 = 0;
    lVar7 = 0;
    while( true ) {
      iVar4 = Element::GetNumChildren
                        ((this->root)._M_t.
                         super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                         super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                         super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,false);
      if (iVar4 <= lVar7) break;
      pEVar5 = (ElementDocument *)
               Element::GetChild((this->root)._M_t.
                                 super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                 .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,
                                 (int)lVar7);
      if (pEVar5 == document) {
        lVar1 = *(long *)&(((this->root)._M_t.
                            super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                            super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                            super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl)->children).
                          super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                          ._M_impl;
        local_38._M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
        super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl =
             *(tuple<Rml::Element_*,_Rml::Releaser<Rml::Element>_> *)
              &((_Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_> *)(lVar1 + lVar6))->
               super__Head_base<0UL,_Rml::Element_*,_false>;
        *(undefined8 *)(lVar1 + lVar6) = 0;
        pEVar2 = (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                 ._M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                 super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
        ::std::
        vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
        ::erase(&pEVar2->children,
                (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
                (*(long *)&(pEVar2->children).
                           super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                           ._M_impl + lVar6));
        pEVar2 = (this->root)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>
                 ._M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                 super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
        puVar3 = (pEVar2->children).
                 super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar4 = Element::GetNumChildren(pEVar2,false);
        ::std::
        vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
        ::_M_insert_rval(&pEVar2->children,puVar3 + iVar4,(value_type *)&local_38);
        Element::DirtyStackingContext
                  ((this->root)._M_t.
                   super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                   super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                   super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl);
        ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
                  ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)&local_38);
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 8;
    }
  }
  return;
}

Assistant:

void Context::PullDocumentToFront(ElementDocument* document)
{
	if (document != root->GetLastChild())
	{
		// Calling RemoveChild() / AppendChild() would be cleaner, but that dirties the document's layout
		// unnecessarily, so we'll go under the hood here.
		for (int i = 0; i < root->GetNumChildren(); ++i)
		{
			if (root->GetChild(i) == document)
			{
				ElementPtr element = std::move(root->children[i]);
				root->children.erase(root->children.begin() + i);
				root->children.insert(root->children.begin() + root->GetNumChildren(), std::move(element));

				root->DirtyStackingContext();
			}
		}
	}
}